

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_do_button_text_symbol
              (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_symbol_type symbol,char *str
              ,int len,nk_flags align,nk_button_behavior behavior,nk_style_button *style,
              nk_user_font *font,nk_input *in)

{
  float fVar1;
  nk_rect r;
  float fVar2;
  float local_78;
  undefined1 local_74 [8];
  nk_rect content;
  nk_rect tri;
  int ret;
  nk_flags align_local;
  int len_local;
  char *str_local;
  nk_symbol_type symbol_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  undefined4 uStack_20;
  nk_rect bounds_local;
  
  bounds_local._0_8_ = bounds._8_8_;
  register0x00001200 = bounds._0_8_;
  memset(&content.w,0,0x10);
  if (style == (nk_style_button *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3800,
                  "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3801,
                  "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3802,
                  "int nk_do_button_text_symbol(nk_flags *, struct nk_command_buffer *, struct nk_rect, enum nk_symbol_type, const char *, int, nk_flags, enum nk_button_behavior, const struct nk_style_button *, const struct nk_user_font *, const struct nk_input *)"
                 );
  }
  if (((out == (nk_command_buffer *)0x0) || (style == (nk_style_button *)0x0)) ||
     (font == (nk_user_font *)0x0)) {
    bounds_local.w = 0.0;
  }
  else {
    r.w = bounds_local.x;
    r.h = bounds_local.y;
    r.x = (float)state_local._4_4_;
    r.y = (float)uStack_20;
    fVar2 = (float)nk_do_button(state,out,r,style,in,behavior,(nk_rect *)local_74);
    content.h = ((float)local_74._4_4_ + content.y / 2.0) - font->height / 2.0;
    if ((align & 1) == 0) {
      fVar1 = (style->padding).x;
      content.w = fVar1 + fVar1 + (float)local_74._0_4_;
    }
    else {
      fVar1 = (style->padding).x;
      local_78 = ((float)local_74._0_4_ + content.x) - (fVar1 + fVar1 + font->height);
      if (local_78 < 0.0) {
        local_78 = 0.0;
      }
      content.w = local_78;
    }
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    }
    nk_draw_button_text_symbol
              (out,(nk_rect *)((long)&state_local + 4),(nk_rect *)local_74,(nk_rect *)&content.w,
               *state,style,str,len,symbol,font);
    bounds_local.w = fVar2;
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return (int)bounds_local.w;
}

Assistant:

NK_INTERN int
nk_do_button_text_symbol(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    enum nk_symbol_type symbol, const char *str, int len, nk_flags align,
    enum nk_button_behavior behavior, const struct nk_style_button *style,
    const struct nk_user_font *font, const struct nk_input *in)
{
    int ret;
    struct nk_rect tri = {0,0,0,0};
    struct nk_rect content;

    NK_ASSERT(style);
    NK_ASSERT(out);
    NK_ASSERT(font);
    if (!out || !style || !font)
        return nk_false;

    ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
    tri.y = content.y + (content.h/2) - font->height/2;
    tri.w = font->height; tri.h = font->height;
    if (align & NK_TEXT_ALIGN_LEFT) {
        tri.x = (content.x + content.w) - (2 * style->padding.x + tri.w);
        tri.x = NK_MAX(tri.x, 0);
    } else tri.x = content.x + 2 * style->padding.x;

    /* draw button */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_button_text_symbol(out, &bounds, &content, &tri,
        *state, style, str, len, symbol, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return ret;
}